

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.hpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0> *
__thiscall
cpptrace::detail::libdwarf::die_object::get_string_attribute_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
           *__return_storage_ptr__,die_object *this,Dwarf_Half attr_num)

{
  int iVar1;
  source_location in_stack_ffffffffffffff88;
  char *raw_str;
  raii_wrapper<Dwarf_Attribute_s_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O2__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:147:51),_0,_0,_0>
  attwrapper;
  Dwarf_Attribute attr;
  raii_wrapper<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O2__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:150:54),_0,_0,_0>
  strwrapper;
  string str;
  
  str._M_dataplus._M_p = (pointer)0x0;
  iVar1 = dwarf_attr(this->die,attr_num,&attr,(Dwarf_Error *)&str);
  if (iVar1 == 1) {
    handle_dwarf_error(this->dbg,(Dwarf_Error)str._M_dataplus._M_p);
  }
  if (iVar1 == 0) {
    attwrapper.obj = attr;
    attwrapper.deleter.holds_value = true;
    str._M_dataplus._M_p = (pointer)0x0;
    iVar1 = dwarf_formstring(attr,&raw_str,(Dwarf_Error *)&str);
    if (iVar1 == 1) {
      handle_dwarf_error(this->dbg,(Dwarf_Error)str._M_dataplus._M_p);
    }
    assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x183728,
                      "optional<std::string> cpptrace::detail::libdwarf::die_object::get_string_attribute(Dwarf_Half) const"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                      ,in_stack_ffffffffffffff88);
    strwrapper.obj = raw_str;
    strwrapper.deleter.holds_value = true;
    strwrapper.deleter.field_0 =
         (anon_union_8_2_d41c7fdf_for_optional<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O2__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:150:54),_0>_2
          )this;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,raw_str,(allocator<char> *)&stack0xffffffffffffff97);
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,&str);
    std::__cxx11::string::~string((string *)&str);
    raii_wrapper<char_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp:150:54),_0,_0,_0>
    ::~raii_wrapper(&strwrapper);
    raii_wrapper<Dwarf_Attribute_s_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp:147:51),_0,_0,_0>
    ::~raii_wrapper(&attwrapper);
  }
  else {
    __return_storage_ptr__->holds_value = false;
  }
  return __return_storage_ptr__;
}

Assistant:

optional<std::string> get_string_attribute(Dwarf_Half attr_num) const {
            Dwarf_Attribute attr;
            if(wrap(dwarf_attr, die, attr_num, &attr) == DW_DLV_OK) {
                auto attwrapper = raii_wrap(attr, [] (Dwarf_Attribute attr) { dwarf_dealloc_attribute(attr); });
                char* raw_str;
                VERIFY(wrap(dwarf_formstring, attr, &raw_str) == DW_DLV_OK);
                auto strwrapper = raii_wrap(raw_str, [this] (char* str) { dwarf_dealloc(dbg, str, DW_DLA_STRING); });
                std::string str = raw_str;
                return str;
            } else {
                return nullopt;
            }
        }